

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::clear(robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
        *this)

{
  bool bVar1;
  robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_RDI;
  bucket_entry<std::pair<unsigned_long,_double>,_false> *bucket;
  iterator __end0;
  iterator __begin0;
  buckets_container_type *__range4;
  vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>_>
  local_18;
  buckets_container_type *local_10;
  
  if (in_RDI->m_min_load_factor <= 0.0) {
    local_10 = &in_RDI->m_buckets_data;
    local_18._M_current =
         (bucket_entry<std::pair<unsigned_long,_double>,_false> *)
         std::
         vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
         ::begin(in_stack_ffffffffffffffc8);
    std::
    vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
    ::end(in_stack_ffffffffffffffc8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>_>
                          *)in_RDI,
                         (__normal_iterator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>_>
                          *)in_stack_ffffffffffffffc8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>_>
      ::operator*(&local_18);
      bucket_entry<std::pair<unsigned_long,_double>,_false>::clear
                ((bucket_entry<std::pair<unsigned_long,_double>,_false> *)in_RDI);
      __gnu_cxx::
      __normal_iterator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>_>
      ::operator++(&local_18);
    }
    in_RDI->m_nb_elements = 0;
    in_RDI->m_grow_on_next_insert = false;
  }
  else {
    clear_and_shrink(in_RDI);
  }
  return;
}

Assistant:

void clear() noexcept {
    if (m_min_load_factor > 0.0f) {
      clear_and_shrink();
    } else {
      for (auto& bucket : m_buckets_data) {
        bucket.clear();
      }

      m_nb_elements = 0;
      m_grow_on_next_insert = false;
    }
  }